

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O0

void __thiscall
Matrix4f::Matrix4f(Matrix4f *this,Vector4f *v0,Vector4f *v1,Vector4f *v2,Vector4f *v3,
                  bool setColumns)

{
  byte bVar1;
  Matrix4f *in_RCX;
  undefined8 in_R8;
  byte in_R9B;
  undefined7 in_stack_ffffffffffffffd0;
  int i;
  
  i = (int)((ulong)in_R8 >> 0x20);
  bVar1 = in_R9B & 1;
  if (bVar1 == 0) {
    setRow(in_RCX,i,(Vector4f *)(CONCAT17(in_R9B,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff));
    setRow(in_RCX,i,(Vector4f *)CONCAT17(bVar1,in_stack_ffffffffffffffd0));
    setRow(in_RCX,i,(Vector4f *)CONCAT17(bVar1,in_stack_ffffffffffffffd0));
    setRow(in_RCX,i,(Vector4f *)CONCAT17(bVar1,in_stack_ffffffffffffffd0));
  }
  else {
    setCol(in_RCX,i,(Vector4f *)(CONCAT17(in_R9B,in_stack_ffffffffffffffd0) & 0x1ffffffffffffff));
    setCol(in_RCX,i,(Vector4f *)CONCAT17(bVar1,in_stack_ffffffffffffffd0));
    setCol(in_RCX,i,(Vector4f *)CONCAT17(bVar1,in_stack_ffffffffffffffd0));
    setCol(in_RCX,i,(Vector4f *)CONCAT17(bVar1,in_stack_ffffffffffffffd0));
  }
  return;
}

Assistant:

Matrix4f::Matrix4f( const Vector4f& v0, const Vector4f& v1, const Vector4f& v2, const Vector4f& v3, bool setColumns )
{
	if( setColumns )
	{
		setCol( 0, v0 );
		setCol( 1, v1 );
		setCol( 2, v2 );
		setCol( 3, v3 );
	}
	else
	{
		setRow( 0, v0 );
		setRow( 1, v1 );
		setRow( 2, v2 );
		setRow( 3, v3 );
	}
}